

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::loadDesired(Executor *this,uint numberOfUnits)

{
  uint uVar1;
  ostream *poVar2;
  reference pvVar3;
  runtime_error *this_00;
  uint local_48;
  uint i;
  allocator<unsigned_int> local_31;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  uint local_14;
  Executor *pEStack_10;
  uint numberOfUnits_local;
  Executor *this_local;
  
  local_14 = numberOfUnits;
  pEStack_10 = this;
  std::allocator<unsigned_int>::allocator(&local_31);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_30,(ulong)numberOfUnits,&local_31);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->m_desired,&local_30);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_30);
  std::allocator<unsigned_int>::~allocator(&local_31);
  local_48 = 0;
  while( true ) {
    if (local_14 <= local_48) {
      return;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Insert desired state of ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_48 + 1);
    std::operator<<(poVar2,". unit:\n> ");
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_desired,(ulong)local_48);
    std::istream::operator>>((istream *)&std::cin,pvVar3);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_desired,(ulong)local_48);
    uVar1 = *pvVar3;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_sizes,(ulong)local_48);
    if (*pvVar3 < uVar1) break;
    local_48 = local_48 + 1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Desired value is bigger than units size.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Executor::loadDesired(const unsigned int numberOfUnits)
{
    m_desired = Values(numberOfUnits);

    for (unsigned int i = 0; i < numberOfUnits; i++)
    {
        std::cout << "Insert desired state of " << (i + 1) << ". unit:\n> ";
        std::cin >> m_desired[i];
        if (m_desired[i] > m_sizes[i])
            throw std::runtime_error("Desired value is bigger than units size.");
    }
}